

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O1

vector<GenTxid,_std::allocator<GenTxid>_> * __thiscall
TxRequestTracker::Impl::GetRequestable
          (vector<GenTxid,_std::allocator<GenTxid>_> *__return_storage_ptr__,Impl *this,NodeId peer,
          microseconds now,
          vector<std::pair<long,_GenTxid>,_std::allocator<std::pair<long,_GenTxid>_>_> *expired)

{
  undefined8 *puVar1;
  iterator __position;
  pointer pGVar2;
  long lVar3;
  iterator iVar4;
  long *plVar5;
  long *__src;
  ulong uVar6;
  undefined8 uVar7;
  ulong uVar8;
  long *plVar9;
  ulong uVar10;
  size_t __n;
  long *plVar11;
  ulong uVar12;
  __normal_iterator<const_(anonymous_namespace)::Announcement_**,_std::vector<const_(anonymous_namespace)::Announcement_*,_std::allocator<const_(anonymous_namespace)::Announcement_*>_>_>
  __i;
  long in_FS_OFFSET;
  GenTxid local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  SetTimePoint(this,now,expired);
  local_60.m_is_wtxid = true;
  local_60.m_hash.super_base_blob<256U>.m_data._M_elems[0] = 0xf9;
  local_60.m_hash.super_base_blob<256U>.m_data._M_elems[1] = 0x8b;
  local_60.m_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_60.m_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_60.m_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_60.m_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_60.m_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_60.m_hash.super_base_blob<256U>.m_data._M_elems[7] = '\x01';
  local_60.m_hash.super_base_blob<256U>.m_data._M_elems[0xf] = (uchar)peer;
  local_60.m_hash.super_base_blob<256U>.m_data._M_elems._16_7_ = SUB87((ulong)peer >> 8,0);
  iVar4 = boost::multi_index::detail::
          ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,std::less<std::tuple<long,bool,uint256_const&>>,boost::multi_index::detail::nth_layer<1,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByPeer,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::lower_bound<std::tuple<long,bool,uint256_const&>>
                    ((ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,std::less<std::tuple<long,bool,uint256_const&>>,boost::multi_index::detail::nth_layer<1,(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>,boost::mpl::v_item<(anonymous_namespace)::ByPeer,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)&(this->m_index).super_type,(tuple<long,_bool,_const_uint256_&> *)&local_60)
  ;
  if (iVar4.node ==
      (this->m_index).
      super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
      .member) {
    plVar9 = (long *)0x0;
    plVar11 = (long *)0x0;
    __src = (long *)0x0;
  }
  else {
    __src = (long *)0x0;
    plVar11 = (long *)0x0;
    plVar9 = (long *)0x0;
    while ((*(long *)((long)&((iVar4.node)->
                             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                             ).
                             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                             .
                             super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                             .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                             data_ + 0x28) == peer &&
           ((uint)((ulong)*(undefined8 *)
                           ((long)&((iVar4.node)->
                                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                   ).
                                   super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                   .
                                   super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                   .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                   space.data_ + 0x30) >> 0x3d) == 2))) {
      if (plVar11 == plVar9) {
        __n = (long)plVar11 - (long)__src;
        if (__n == 0x7ffffffffffffff8) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            uVar7 = std::__throw_length_error("vector::_M_realloc_insert");
            pGVar2 = (__return_storage_ptr__->super__Vector_base<GenTxid,_std::allocator<GenTxid>_>)
                     ._M_impl.super__Vector_impl_data._M_start;
            if (pGVar2 != (pointer)0x0) {
              operator_delete(pGVar2,(long)(__return_storage_ptr__->
                                           super__Vector_base<GenTxid,_std::allocator<GenTxid>_>).
                                           _M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)pGVar2);
            }
            if (peer != 0) {
              operator_delete((void *)peer,(long)plVar9 - peer);
            }
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              _Unwind_Resume(uVar7);
            }
          }
          goto LAB_003f818e;
        }
        uVar10 = (long)__n >> 3;
        uVar6 = 1;
        if (plVar11 != __src) {
          uVar6 = uVar10;
        }
        uVar8 = uVar6 + uVar10;
        if (0xffffffffffffffe < uVar8) {
          uVar8 = 0xfffffffffffffff;
        }
        uVar12 = 0xfffffffffffffff;
        if (!CARRY8(uVar6,uVar10)) {
          uVar12 = uVar8;
        }
        if (uVar12 == 0) {
          plVar5 = (long *)0x0;
        }
        else {
          plVar5 = (long *)operator_new(uVar12 * 8);
        }
        plVar5[uVar10] = (long)iVar4.node;
        if (0 < (long)__n) {
          memmove(plVar5,__src,__n);
        }
        if (__src != (long *)0x0) {
          operator_delete(__src,(long)plVar9 - (long)__src);
        }
        plVar11 = (long *)(__n + (long)plVar5);
        plVar9 = plVar5 + uVar12;
        __src = plVar5;
      }
      else {
        *plVar11 = (long)iVar4.node;
      }
      local_60.m_is_wtxid =
           SUB81(&(iVar4.node)->
                  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                 ,0);
      local_60.m_hash.super_base_blob<256U>.m_data._M_elems._0_7_ =
           SUB87((ulong)&(iVar4.node)->
                         super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                 >> 8,0);
      boost::multi_index::detail::
      ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
      ::increment((pointer *)&local_60);
      plVar11 = plVar11 + 1;
      iVar4.node = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                    *)(CONCAT71(local_60.m_hash.super_base_blob<256U>.m_data._M_elems._0_7_,
                                local_60.m_is_wtxid) + -0x68);
      if (CONCAT71(local_60.m_hash.super_base_blob<256U>.m_data._M_elems._0_7_,local_60.m_is_wtxid)
          == 0) {
        iVar4.node = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                      *)0x0;
      }
      if (iVar4.node ==
          (this->m_index).
          super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
          .member) break;
    }
  }
  if (__src != plVar11) {
    uVar6 = (long)plVar11 - (long)__src >> 3;
    lVar3 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<(anonymous_namespace)::Announcement_const**,std::vector<(anonymous_namespace)::Announcement_const*,std::allocator<(anonymous_namespace)::Announcement_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<TxRequestTracker::Impl::GetRequestable(long,std::chrono::duration<long,std::ratio<1l,1000000l>>,std::vector<std::pair<long,GenTxid>,std::allocator<std::pair<long,GenTxid>>>*)::_lambda((anonymous_namespace)::Announcement_const*,(anonymous_namespace)::Announcement_const*)_1_>>
              (__src,plVar11,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)plVar11 - (long)__src < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::Announcement_const**,std::vector<(anonymous_namespace)::Announcement_const*,std::allocator<(anonymous_namespace)::Announcement_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<TxRequestTracker::Impl::GetRequestable(long,std::chrono::duration<long,std::ratio<1l,1000000l>>,std::vector<std::pair<long,GenTxid>,std::allocator<std::pair<long,GenTxid>>>*)::_lambda((anonymous_namespace)::Announcement_const*,(anonymous_namespace)::Announcement_const*)_1_>>
                (__src,plVar11);
    }
    else {
      plVar5 = __src + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::Announcement_const**,std::vector<(anonymous_namespace)::Announcement_const*,std::allocator<(anonymous_namespace)::Announcement_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<TxRequestTracker::Impl::GetRequestable(long,std::chrono::duration<long,std::ratio<1l,1000000l>>,std::vector<std::pair<long,GenTxid>,std::allocator<std::pair<long,GenTxid>>>*)::_lambda((anonymous_namespace)::Announcement_const*,(anonymous_namespace)::Announcement_const*)_1_>>
                (__src,plVar5);
      for (; plVar5 != plVar11; plVar5 = plVar5 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::Announcement_const**,std::vector<(anonymous_namespace)::Announcement_const*,std::allocator<(anonymous_namespace)::Announcement_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<TxRequestTracker::Impl::GetRequestable(long,std::chrono::duration<long,std::ratio<1l,1000000l>>,std::vector<std::pair<long,GenTxid>,std::allocator<std::pair<long,GenTxid>>>*)::_lambda((anonymous_namespace)::Announcement_const*,(anonymous_namespace)::Announcement_const*)_1_>>
                  (plVar5);
      }
    }
  }
  (__return_storage_ptr__->super__Vector_base<GenTxid,_std::allocator<GenTxid>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<GenTxid,_std::allocator<GenTxid>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<GenTxid,_std::allocator<GenTxid>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<GenTxid,_std::allocator<GenTxid>_>::reserve
            (__return_storage_ptr__,(long)plVar11 - (long)__src >> 3);
  if (__src != plVar11) {
    plVar5 = __src;
    do {
      puVar1 = (undefined8 *)*plVar5;
      local_60.m_is_wtxid = (puVar1[6] & 0x1000000000000000) != 0;
      local_60.m_hash.super_base_blob<256U>.m_data._M_elems._16_7_ = SUB87(puVar1[2],0);
      local_60.m_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
           (uchar)((ulong)puVar1[2] >> 0x38);
      local_60.m_hash.super_base_blob<256U>.m_data._M_elems._24_7_ = SUB87(puVar1[3],0);
      local_60.m_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
           (uchar)((ulong)puVar1[3] >> 0x38);
      local_60.m_hash.super_base_blob<256U>.m_data._M_elems._0_7_ = SUB87(*puVar1,0);
      local_60.m_hash.super_base_blob<256U>.m_data._M_elems[7] = (uchar)((ulong)*puVar1 >> 0x38);
      local_60.m_hash.super_base_blob<256U>.m_data._M_elems._8_7_ = SUB87(puVar1[1],0);
      local_60.m_hash.super_base_blob<256U>.m_data._M_elems[0xf] = (uchar)((ulong)puVar1[1] >> 0x38)
      ;
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<GenTxid,_std::allocator<GenTxid>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<GenTxid,_std::allocator<GenTxid>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<GenTxid,_std::allocator<GenTxid>_>::_M_realloc_insert<GenTxid>
                  (__return_storage_ptr__,__position,&local_60);
      }
      else {
        ((__position._M_current)->m_hash).super_base_blob<256U>.m_data._M_elems[0x1f] =
             local_60.m_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
        *(ulong *)(((__position._M_current)->m_hash).super_base_blob<256U>.m_data._M_elems + 0xf) =
             CONCAT71(local_60.m_hash.super_base_blob<256U>.m_data._M_elems._16_7_,
                      local_60.m_hash.super_base_blob<256U>.m_data._M_elems[0xf]);
        *(ulong *)(((__position._M_current)->m_hash).super_base_blob<256U>.m_data._M_elems + 0x17) =
             CONCAT71(local_60.m_hash.super_base_blob<256U>.m_data._M_elems._24_7_,
                      local_60.m_hash.super_base_blob<256U>.m_data._M_elems[0x17]);
        (__position._M_current)->m_is_wtxid = local_60.m_is_wtxid;
        ((__position._M_current)->m_hash).super_base_blob<256U>.m_data._M_elems[0] =
             local_60.m_hash.super_base_blob<256U>.m_data._M_elems[0];
        ((__position._M_current)->m_hash).super_base_blob<256U>.m_data._M_elems[1] =
             local_60.m_hash.super_base_blob<256U>.m_data._M_elems[1];
        ((__position._M_current)->m_hash).super_base_blob<256U>.m_data._M_elems[2] =
             local_60.m_hash.super_base_blob<256U>.m_data._M_elems[2];
        ((__position._M_current)->m_hash).super_base_blob<256U>.m_data._M_elems[3] =
             local_60.m_hash.super_base_blob<256U>.m_data._M_elems[3];
        ((__position._M_current)->m_hash).super_base_blob<256U>.m_data._M_elems[4] =
             local_60.m_hash.super_base_blob<256U>.m_data._M_elems[4];
        ((__position._M_current)->m_hash).super_base_blob<256U>.m_data._M_elems[5] =
             local_60.m_hash.super_base_blob<256U>.m_data._M_elems[5];
        ((__position._M_current)->m_hash).super_base_blob<256U>.m_data._M_elems[6] =
             local_60.m_hash.super_base_blob<256U>.m_data._M_elems[6];
        *(ulong *)(((__position._M_current)->m_hash).super_base_blob<256U>.m_data._M_elems + 7) =
             CONCAT71(local_60.m_hash.super_base_blob<256U>.m_data._M_elems._8_7_,
                      local_60.m_hash.super_base_blob<256U>.m_data._M_elems[7]);
        (__return_storage_ptr__->super__Vector_base<GenTxid,_std::allocator<GenTxid>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      plVar5 = plVar5 + 1;
    } while (plVar5 != plVar11);
  }
  if (__src != (long *)0x0) {
    operator_delete(__src,(long)plVar9 - (long)__src);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_003f818e:
  __stack_chk_fail();
}

Assistant:

std::vector<GenTxid> GetRequestable(NodeId peer, std::chrono::microseconds now,
        std::vector<std::pair<NodeId, GenTxid>>* expired)
    {
        // Move time.
        SetTimePoint(now, expired);

        // Find all CANDIDATE_BEST announcements for this peer.
        std::vector<const Announcement*> selected;
        auto it_peer = m_index.get<ByPeer>().lower_bound(ByPeerView{peer, true, uint256::ZERO});
        while (it_peer != m_index.get<ByPeer>().end() && it_peer->m_peer == peer &&
            it_peer->GetState() == State::CANDIDATE_BEST) {
            selected.emplace_back(&*it_peer);
            ++it_peer;
        }

        // Sort by sequence number.
        std::sort(selected.begin(), selected.end(), [](const Announcement* a, const Announcement* b) {
            return a->m_sequence < b->m_sequence;
        });

        // Convert to GenTxid and return.
        std::vector<GenTxid> ret;
        ret.reserve(selected.size());
        std::transform(selected.begin(), selected.end(), std::back_inserter(ret), [](const Announcement* ann) {
            return ToGenTxid(*ann);
        });
        return ret;
    }